

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O2

Error asmjit::X86Internal::argsToFrameInfo(FuncArgsMapper *args,FuncFrameInfo *ffi)

{
  Error EVar1;
  X86FuncArgsContext ctx;
  X86FuncArgsContext local_118;
  
  local_118._hasStackArgs = false;
  local_118._hasRegSwaps = false;
  local_118._workData[3].archRegs = 0;
  local_118._workData[3].workRegs = 0;
  local_118._workData[3].usedRegs = 0;
  local_118._workData[3].srcRegs = 0;
  local_118._workData[3].dstRegs = 0;
  local_118._workData[3].numOps = '\0';
  local_118._workData[3].numSwaps = '\0';
  local_118._workData[3].numStackArgs = '\0';
  local_118._workData[3].reserved[0] = '\0';
  local_118._workData[3].reserved[1] = '\0';
  local_118._workData[3].reserved[2] = '\0';
  local_118._workData[3].reserved[3] = '\0';
  local_118._workData[3].reserved[4] = '\0';
  local_118._workData[3].reserved[5] = '\0';
  local_118._workData[3].reserved[6] = '\0';
  local_118._workData[3].reserved[7] = '\0';
  local_118._workData[3].reserved[8] = '\0';
  local_118._workData[3].argIndex[0] = '\0';
  local_118._workData[3].argIndex[1] = '\0';
  local_118._workData[3].argIndex[2] = '\0';
  local_118._workData[3].argIndex[3] = '\0';
  local_118._workData[3].argIndex[4] = '\0';
  local_118._workData[3].argIndex[5] = '\0';
  local_118._workData[3].argIndex[6] = '\0';
  local_118._workData[3].argIndex[7] = '\0';
  local_118._workData[3].argIndex[8] = '\0';
  local_118._workData[3].argIndex[9] = '\0';
  local_118._workData[3].argIndex[10] = '\0';
  local_118._workData[3].argIndex[0xb] = '\0';
  local_118._workData[3].argIndex[0xc] = '\0';
  local_118._workData[3].argIndex[0xd] = '\0';
  local_118._workData[3].argIndex[0xe] = '\0';
  local_118._workData[3].argIndex[0xf] = '\0';
  local_118._workData[3].argIndex[0x10] = '\0';
  local_118._workData[3].argIndex[0x11] = '\0';
  local_118._workData[3].argIndex[0x12] = '\0';
  local_118._workData[3].argIndex[0x13] = '\0';
  local_118._workData[3].argIndex[0x14] = '\0';
  local_118._workData[3].argIndex[0x15] = '\0';
  local_118._workData[3].argIndex[0x16] = '\0';
  local_118._workData[3].argIndex[0x17] = '\0';
  local_118._workData[3].argIndex[0x18] = '\0';
  local_118._workData[3].argIndex[0x19] = '\0';
  local_118._workData[3].argIndex[0x1a] = '\0';
  local_118._workData[3].argIndex[0x1b] = '\0';
  local_118._workData[3].argIndex[0x1c] = '\0';
  local_118._workData[3].argIndex[0x1d] = '\0';
  local_118._workData[3].argIndex[0x1e] = '\0';
  local_118._workData[3].argIndex[0x1f] = '\0';
  local_118._workData[2].archRegs = 0;
  local_118._workData[2].workRegs = 0;
  local_118._workData[2].usedRegs = 0;
  local_118._workData[2].srcRegs = 0;
  local_118._workData[2].dstRegs = 0;
  local_118._workData[2].numOps = '\0';
  local_118._workData[2].numSwaps = '\0';
  local_118._workData[2].numStackArgs = '\0';
  local_118._workData[2].reserved[0] = '\0';
  local_118._workData[2].reserved[1] = '\0';
  local_118._workData[2].reserved[2] = '\0';
  local_118._workData[2].reserved[3] = '\0';
  local_118._workData[2].reserved[4] = '\0';
  local_118._workData[2].reserved[5] = '\0';
  local_118._workData[2].reserved[6] = '\0';
  local_118._workData[2].reserved[7] = '\0';
  local_118._workData[2].reserved[8] = '\0';
  local_118._workData[2].argIndex[0] = '\0';
  local_118._workData[2].argIndex[1] = '\0';
  local_118._workData[2].argIndex[2] = '\0';
  local_118._workData[2].argIndex[3] = '\0';
  local_118._workData[2].argIndex[4] = '\0';
  local_118._workData[2].argIndex[5] = '\0';
  local_118._workData[2].argIndex[6] = '\0';
  local_118._workData[2].argIndex[7] = '\0';
  local_118._workData[2].argIndex[8] = '\0';
  local_118._workData[2].argIndex[9] = '\0';
  local_118._workData[2].argIndex[10] = '\0';
  local_118._workData[2].argIndex[0xb] = '\0';
  local_118._workData[2].argIndex[0xc] = '\0';
  local_118._workData[2].argIndex[0xd] = '\0';
  local_118._workData[2].argIndex[0xe] = '\0';
  local_118._workData[2].argIndex[0xf] = '\0';
  local_118._workData[2].argIndex[0x10] = '\0';
  local_118._workData[2].argIndex[0x11] = '\0';
  local_118._workData[2].argIndex[0x12] = '\0';
  local_118._workData[2].argIndex[0x13] = '\0';
  local_118._workData[2].argIndex[0x14] = '\0';
  local_118._workData[2].argIndex[0x15] = '\0';
  local_118._workData[2].argIndex[0x16] = '\0';
  local_118._workData[2].argIndex[0x17] = '\0';
  local_118._workData[2].argIndex[0x18] = '\0';
  local_118._workData[2].argIndex[0x19] = '\0';
  local_118._workData[2].argIndex[0x1a] = '\0';
  local_118._workData[2].argIndex[0x1b] = '\0';
  local_118._workData[2].argIndex[0x1c] = '\0';
  local_118._workData[2].argIndex[0x1d] = '\0';
  local_118._workData[2].argIndex[0x1e] = '\0';
  local_118._workData[2].argIndex[0x1f] = '\0';
  local_118._workData[1].archRegs = 0;
  local_118._workData[1].workRegs = 0;
  local_118._workData[1].usedRegs = 0;
  local_118._workData[1].srcRegs = 0;
  local_118._workData[1].dstRegs = 0;
  local_118._workData[1].numOps = '\0';
  local_118._workData[1].numSwaps = '\0';
  local_118._workData[1].numStackArgs = '\0';
  local_118._workData[1].reserved[0] = '\0';
  local_118._workData[1].reserved[1] = '\0';
  local_118._workData[1].reserved[2] = '\0';
  local_118._workData[1].reserved[3] = '\0';
  local_118._workData[1].reserved[4] = '\0';
  local_118._workData[1].reserved[5] = '\0';
  local_118._workData[1].reserved[6] = '\0';
  local_118._workData[1].reserved[7] = '\0';
  local_118._workData[1].reserved[8] = '\0';
  local_118._workData[1].argIndex[0] = '\0';
  local_118._workData[1].argIndex[1] = '\0';
  local_118._workData[1].argIndex[2] = '\0';
  local_118._workData[1].argIndex[3] = '\0';
  local_118._workData[1].argIndex[4] = '\0';
  local_118._workData[1].argIndex[5] = '\0';
  local_118._workData[1].argIndex[6] = '\0';
  local_118._workData[1].argIndex[7] = '\0';
  local_118._workData[1].argIndex[8] = '\0';
  local_118._workData[1].argIndex[9] = '\0';
  local_118._workData[1].argIndex[10] = '\0';
  local_118._workData[1].argIndex[0xb] = '\0';
  local_118._workData[1].argIndex[0xc] = '\0';
  local_118._workData[1].argIndex[0xd] = '\0';
  local_118._workData[1].argIndex[0xe] = '\0';
  local_118._workData[1].argIndex[0xf] = '\0';
  local_118._workData[1].argIndex[0x10] = '\0';
  local_118._workData[1].argIndex[0x11] = '\0';
  local_118._workData[1].argIndex[0x12] = '\0';
  local_118._workData[1].argIndex[0x13] = '\0';
  local_118._workData[1].argIndex[0x14] = '\0';
  local_118._workData[1].argIndex[0x15] = '\0';
  local_118._workData[1].argIndex[0x16] = '\0';
  local_118._workData[1].argIndex[0x17] = '\0';
  local_118._workData[1].argIndex[0x18] = '\0';
  local_118._workData[1].argIndex[0x19] = '\0';
  local_118._workData[1].argIndex[0x1a] = '\0';
  local_118._workData[1].argIndex[0x1b] = '\0';
  local_118._workData[1].argIndex[0x1c] = '\0';
  local_118._workData[1].argIndex[0x1d] = '\0';
  local_118._workData[1].argIndex[0x1e] = '\0';
  local_118._workData[1].argIndex[0x1f] = '\0';
  local_118._workData[0].archRegs = 0;
  local_118._workData[0].workRegs = 0;
  local_118._workData[0].usedRegs = 0;
  local_118._workData[0].srcRegs = 0;
  local_118._workData[0].dstRegs = 0;
  local_118._workData[0].numOps = '\0';
  local_118._workData[0].numSwaps = '\0';
  local_118._workData[0].numStackArgs = '\0';
  local_118._workData[0].reserved[0] = '\0';
  local_118._workData[0].reserved[1] = '\0';
  local_118._workData[0].reserved[2] = '\0';
  local_118._workData[0].reserved[3] = '\0';
  local_118._workData[0].reserved[4] = '\0';
  local_118._workData[0].reserved[5] = '\0';
  local_118._workData[0].reserved[6] = '\0';
  local_118._workData[0].reserved[7] = '\0';
  local_118._workData[0].reserved[8] = '\0';
  local_118._workData[0].argIndex[0] = '\0';
  local_118._workData[0].argIndex[1] = '\0';
  local_118._workData[0].argIndex[2] = '\0';
  local_118._workData[0].argIndex[3] = '\0';
  local_118._workData[0].argIndex[4] = '\0';
  local_118._workData[0].argIndex[5] = '\0';
  local_118._workData[0].argIndex[6] = '\0';
  local_118._workData[0].argIndex[7] = '\0';
  local_118._workData[0].argIndex[8] = '\0';
  local_118._workData[0].argIndex[9] = '\0';
  local_118._workData[0].argIndex[10] = '\0';
  local_118._workData[0].argIndex[0xb] = '\0';
  local_118._workData[0].argIndex[0xc] = '\0';
  local_118._workData[0].argIndex[0xd] = '\0';
  local_118._workData[0].argIndex[0xe] = '\0';
  local_118._workData[0].argIndex[0xf] = '\0';
  local_118._workData[0].argIndex[0x10] = '\0';
  local_118._workData[0].argIndex[0x11] = '\0';
  local_118._workData[0].argIndex[0x12] = '\0';
  local_118._workData[0].argIndex[0x13] = '\0';
  local_118._workData[0].argIndex[0x14] = '\0';
  local_118._workData[0].argIndex[0x15] = '\0';
  local_118._workData[0].argIndex[0x16] = '\0';
  local_118._workData[0].argIndex[0x17] = '\0';
  local_118._workData[0].argIndex[0x18] = '\0';
  local_118._workData[0].argIndex[0x19] = '\0';
  local_118._workData[0].argIndex[0x1a] = '\0';
  local_118._workData[0].argIndex[0x1b] = '\0';
  local_118._workData[0].argIndex[0x1c] = '\0';
  local_118._workData[0].argIndex[0x1d] = '\0';
  local_118._workData[0].argIndex[0x1e] = '\0';
  local_118._workData[0].argIndex[0x1f] = '\0';
  EVar1 = X86FuncArgsContext::initWorkData
                    (&local_118,args,ffi->_dirtyRegs,(bool)((byte)ffi->_attributes & 1));
  if (EVar1 == 0) {
    X86FuncArgsContext::markDstRegsDirty(&local_118,ffi);
    X86FuncArgsContext::markRegsForSwaps(&local_118,ffi);
    EVar1 = X86FuncArgsContext::markStackArgsReg(&local_118,ffi);
  }
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::argsToFrameInfo(const FuncArgsMapper& args, FuncFrameInfo& ffi) noexcept {
  X86FuncArgsContext ctx;
  ASMJIT_PROPAGATE(ctx.initWorkData(args, ffi._dirtyRegs, ffi.hasPreservedFP()));

  ASMJIT_PROPAGATE(ctx.markDstRegsDirty(ffi));
  ASMJIT_PROPAGATE(ctx.markRegsForSwaps(ffi));
  ASMJIT_PROPAGATE(ctx.markStackArgsReg(ffi));
  return kErrorOk;
}